

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_base_clang.hpp
# Opt level: O2

void __thiscall boost::detail::sp_counted_base::release(sp_counted_base *this)

{
  atomic_int_least32_t *paVar1;
  
  LOCK();
  paVar1 = &this->use_count_;
  *paVar1 = *paVar1 + -1;
  UNLOCK();
  if (*paVar1 == 0) {
    (*this->_vptr_sp_counted_base[2])();
    LOCK();
    paVar1 = &this->weak_count_;
    *paVar1 = *paVar1 + -1;
    UNLOCK();
    if (*paVar1 == 0) {
      (*this->_vptr_sp_counted_base[3])(this);
      return;
    }
  }
  return;
}

Assistant:

inline boost::int_least32_t atomic_decrement( atomic_int_least32_t * pw )
{
    return __c11_atomic_fetch_sub( pw, 1, __ATOMIC_ACQ_REL );
}